

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTargetIDList.cpp
# Opt level: O2

void __thiscall LinkTargetIDList::printLinkTargetIdListInHexStyle(LinkTargetIDList *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________LinkTargetIdList in Hex Style___________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"IDListSize:                         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&this->IDListSize);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  poVar1 = std::operator<<((ostream *)&std::cout,"IDList:                             ");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->IDList).
                             super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->IDList).
                            super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"   ItemID ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3 + 1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"       ItemIDSize:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->IDList).
                         super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ItemIDSize).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
               lVar2));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::operator<<((ostream *)&std::cout,"       Data:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->IDList).
                         super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Data).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
               lVar2));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
    lVar2 = lVar2 + 0x30;
  }
  std::operator<<((ostream *)&std::cout,"   TerminalID:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,&this->TerminalID);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void LinkTargetIDList::printLinkTargetIdListInHexStyle() {
    cout <<"_________________LinkTargetIdList in Hex Style___________________" << endl;
    cout << "IDListSize:                         " ; Utils::print_vec(IDListSize);
    cout << "IDList:                             " << endl ;
    for(int i = 0; i < IDList.size(); ++i){
        cout << "   ItemID " << dec << i + 1 << endl;
        cout << "       ItemIDSize:                  "; Utils::print_vec(IDList[i].ItemIDSize);
        cout << "       Data:                        "; Utils::print_vec(IDList[i].Data);
    }
    cout << "   TerminalID:                      "; Utils::print_vec(TerminalID);
    cout << "_________________________________________________________" << endl;
}